

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderMoveToFirstAttribute(xmlTextReaderPtr reader)

{
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node->type == XML_ELEMENT_NODE) {
    if (reader->node->nsDef == (xmlNs *)0x0) {
      if (reader->node->properties == (_xmlAttr *)0x0) {
        reader_local._4_4_ = 0;
      }
      else {
        reader->curnode = (xmlNodePtr)reader->node->properties;
        reader_local._4_4_ = 1;
      }
    }
    else {
      reader->curnode = (xmlNodePtr)reader->node->nsDef;
      reader_local._4_4_ = 1;
    }
  }
  else {
    reader_local._4_4_ = 0;
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderMoveToFirstAttribute(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(-1);
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);

    if (reader->node->nsDef != NULL) {
	reader->curnode = (xmlNodePtr) reader->node->nsDef;
	return(1);
    }
    if (reader->node->properties != NULL) {
	reader->curnode = (xmlNodePtr) reader->node->properties;
	return(1);
    }
    return(0);
}